

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
find<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr&>
          (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,char (*params) [7])

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  char *__s1;
  undefined8 *in_R8;
  ulong uVar5;
  Maybe<unsigned_long> MVar6;
  Iterator iter;
  size_t local_60;
  char (*local_58) [7];
  Iterator local_50;
  SearchKey local_38;
  StringPtr *local_30;
  size_t *local_28;
  
  local_60 = table.size_;
  local_30 = table.ptr;
  local_28 = &local_60;
  local_38._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00225340;
  local_58 = params;
  _::BTreeImpl::search(&local_50,(BTreeImpl *)&(local_30->content).size_,&local_38);
  __n = extraout_RDX;
  if (((ulong)local_50.row != 0xe) && (uVar1 = (local_50.leaf)->rows[local_50.row].i, uVar1 != 0)) {
    uVar5 = (ulong)(uVar1 - 1);
    lVar4 = uVar5 * 0x20;
    lVar2 = *(long *)(local_60 + 8 + lVar4);
    __n.value = lVar2 + (ulong)(lVar2 == 0);
    if (__n.value == in_R8[1]) {
      if (lVar2 == 0) {
        __s1 = "";
      }
      else {
        __s1 = *(char **)(local_60 + lVar4);
      }
      iVar3 = bcmp(__s1,(void *)*in_R8,__n.value);
      __n = extraout_RDX_00;
      if (iVar3 == 0) {
        *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x1;
        *(ulong *)(this + 8) = uVar5;
        goto LAB_00176990;
      }
    }
  }
  *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x0;
LAB_00176990:
  MVar6.ptr.field_1.value = __n.value;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar6.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return kj::none;
    }
  }